

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

bool __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::HasZeroPageQueue(PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                   *this)

{
  BackgroundPageQueue *pBVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  bool bVar5;
  
  pBVar1 = this->backgroundPageQueue;
  bVar5 = (bool)(pBVar1 != (BackgroundPageQueue *)0x0 & this->zeroPages);
  if ((pBVar1 != (BackgroundPageQueue *)0x0) && (pBVar1->isZeroPageQueue != bVar5)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x318,
                       "(backgroundPageQueue == nullptr || hasZeroPageQueue == backgroundPageQueue->isZeroPageQueue)"
                       ,
                       "backgroundPageQueue == nullptr || hasZeroPageQueue == backgroundPageQueue->isZeroPageQueue"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return bVar5;
}

Assistant:

bool
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::HasZeroPageQueue() const
{
    bool hasZeroPageQueue = (ZeroPages() && this->backgroundPageQueue != nullptr);
    Assert(backgroundPageQueue == nullptr || hasZeroPageQueue == backgroundPageQueue->isZeroPageQueue);
    return hasZeroPageQueue;
}